

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall t_json_generator::write_comma_if_needed(t_json_generator *this)

{
  reference pvVar1;
  ostream *poVar2;
  t_json_generator *this_local;
  
  pvVar1 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top(&this->comma_needed_);
  if ((*pvVar1 & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&this->f_json_,",");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  return;
}

Assistant:

void t_json_generator::write_comma_if_needed() {
  if (comma_needed_.top()) {
    f_json_ << "," << endl;
  }
}